

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwaitcondition_unix.cpp
# Opt level: O0

void __thiscall QWaitCondition::~QWaitCondition(QWaitCondition *this)

{
  long *in_RDI;
  char *in_stack_ffffffffffffffe8;
  
  pthread_cond_destroy((pthread_cond_t *)(*in_RDI + 0x28));
  qt_report_pthread_error((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffe8,(char *)0x6d9838);
  pthread_mutex_destroy((pthread_mutex_t *)*in_RDI);
  qt_report_pthread_error((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffe8,(char *)0x6d985c);
  if ((void *)*in_RDI != (void *)0x0) {
    operator_delete((void *)*in_RDI,0x60);
  }
  return;
}

Assistant:

QWaitCondition::~QWaitCondition()
{
    qt_report_pthread_error(pthread_cond_destroy(&d->cond), "QWaitCondition", "cv destroy");
    qt_report_pthread_error(pthread_mutex_destroy(&d->mutex), "QWaitCondition", "mutex destroy");
    delete d;
}